

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O2

void __thiscall CornellBox::CornellBox(CornellBox *this)

{
  ColorRGB local_170;
  tmat4x4<float> local_160;
  tmat4x4<float> local_120;
  tmat4x4<float> local_e0;
  tmat4x4<float> local_a0;
  mat4 local_60;
  
  glm::translate<float>(&local_e0,0.0,0.0,-40.0);
  glm::scale<float>(&local_120,20.0,20.0,20.0);
  glm::detail::operator*(&local_e0,&local_120);
  glm::translate<float>(&local_160,-0.5,-0.5,0.5);
  glm::detail::operator*(&local_a0,&local_160);
  ColorRGB::ColorRGB(&local_170);
  SceneObject::SceneObject(&this->super_SceneObject,&local_60,local_170);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__CornellBox_0010bcd0;
  memset(&this->triangles,0,0xa8);
  _calculateGeometry(this);
  return;
}

Assistant:

CornellBox::CornellBox() : 
    SceneObject(
        glm::translate<float>(0, 0, -40) *
        glm::scale<float>(20, 20, 20) *
        glm::translate<float>(-0.5, -0.5, 0.5),
        ColorRGB()) {
    _calculateGeometry();
}